

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlUTF8Strlen(xmlChar *utf)

{
  int local_28;
  ulong local_20;
  size_t ret;
  xmlChar *utf_local;
  
  local_20 = 0;
  ret = (size_t)utf;
  if (utf == (xmlChar *)0x0) {
    utf_local._4_4_ = -1;
  }
  else {
    while (*(char *)ret != '\0') {
      if ((*(byte *)ret & 0x80) == 0) {
        ret = ret + 1;
      }
      else {
        if ((*(byte *)(ret + 1) & 0xc0) != 0x80) {
          return -1;
        }
        if ((*(byte *)ret & 0xe0) == 0xe0) {
          if ((*(byte *)(ret + 2) & 0xc0) != 0x80) {
            return -1;
          }
          if ((*(byte *)ret & 0xf0) == 0xf0) {
            if (((*(byte *)ret & 0xf8) != 0xf0) || ((*(byte *)(ret + 3) & 0xc0) != 0x80)) {
              return -1;
            }
            ret = ret + 4;
          }
          else {
            ret = ret + 3;
          }
        }
        else {
          ret = ret + 2;
        }
      }
      local_20 = local_20 + 1;
    }
    if (local_20 < 0x80000000) {
      local_28 = (int)local_20;
    }
    else {
      local_28 = 0;
    }
    utf_local._4_4_ = local_28;
  }
  return utf_local._4_4_;
}

Assistant:

int
xmlUTF8Strlen(const xmlChar *utf) {
    size_t ret = 0;

    if (utf == NULL)
        return(-1);

    while (*utf != 0) {
        if (utf[0] & 0x80) {
            if ((utf[1] & 0xc0) != 0x80)
                return(-1);
            if ((utf[0] & 0xe0) == 0xe0) {
                if ((utf[2] & 0xc0) != 0x80)
                    return(-1);
                if ((utf[0] & 0xf0) == 0xf0) {
                    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
                        return(-1);
                    utf += 4;
                } else {
                    utf += 3;
                }
            } else {
                utf += 2;
            }
        } else {
            utf++;
        }
        ret++;
    }
    return(ret > INT_MAX ? 0 : ret);
}